

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

Instr * __thiscall
GlobOpt::ToVar(GlobOpt *this,Instr *instr,RegOpnd *regOpnd,BasicBlock *block,Value *value,
              bool needsUpdate)

{
  StackSym *this_00;
  BasicBlock *pBVar1;
  code *pcVar2;
  undefined4 uVar3;
  GlobOpt *pGVar4;
  BasicBlock *pBVar5;
  bool bVar6;
  BOOLEAN BVar7;
  anon_union_2_4_ea848c7b_for_ValueType_13 valueType;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar8;
  StackSym *sym;
  undefined7 extraout_var;
  ValueInfo *this_01;
  undefined7 extraout_var_00;
  IntConstOpnd *this_02;
  Instr *this_03;
  RegOpnd *this_04;
  SymOpnd *this_05;
  PropertySymOpnd *this_06;
  Func *func;
  long lVar9;
  Instr *afterThisInstr;
  Func **ppFVar10;
  OpCode opcode;
  undefined7 in_register_00000089;
  IRType type;
  int local_70;
  undefined4 local_6c;
  int32 intConstantValue;
  GlobOpt *local_60;
  Value *local_58;
  RegOpnd *local_50;
  ValueInfo *local_48;
  BasicBlock *local_40;
  GlobOptBlockData *local_38;
  
  local_6c = (undefined4)CONCAT71(in_register_00000089,needsUpdate);
  this_00 = regOpnd->m_sym;
  local_40 = block;
  bVar6 = IsTypeSpecPhaseOff(this->func);
  if (bVar6) {
    return instr;
  }
  if (this->prePassLoop != (Loop *)0x0) {
    BVSparse<Memory::JitArenaAllocator>::Set
              ((local_40->globOptData).liveVarSyms,(this_00->super_Sym).m_id);
    return instr;
  }
  local_60 = this;
  BVar7 = BVSparse<Memory::JitArenaAllocator>::Test
                    ((local_40->globOptData).liveVarSyms,(this_00->super_Sym).m_id);
  if (BVar7 != '\0') {
    return instr;
  }
  if (this_00->m_type != TyVar) {
    if ((this_00->field_0x1a & 1) == 0) {
      return instr;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x2c73,"(!varSym->IsTypeSpec())","!varSym->IsTypeSpec()");
    if (bVar6) {
      *puVar8 = 0;
      return instr;
    }
    goto LAB_0041c626;
  }
  local_38 = &local_40->globOptData;
  bVar6 = GlobOptBlockData::IsTypeSpecialized(local_38,&this_00->super_Sym);
  if (!bVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x2c78,"(block->globOptData.IsTypeSpecialized(varSym))",
                       "block->globOptData.IsTypeSpecialized(varSym)");
    if (!bVar6) goto LAB_0041c626;
    *puVar8 = 0;
  }
  local_50 = regOpnd;
  if ((value == (Value *)0x0) &&
     (value = GlobOptBlockData::FindValue(local_38,&this_00->super_Sym), value == (Value *)0x0)) {
    bVar6 = true;
    local_48 = (ValueInfo *)0x0;
    local_58 = (Value *)0x0;
  }
  else {
    local_48 = value->valueInfo;
    local_58 = value;
    if (local_48 == (ValueInfo *)0x0) {
      bVar6 = true;
      local_48 = (ValueInfo *)0x0;
    }
    else {
      bVar6 = ValueType::IsInt(&local_48->super_ValueType);
      if (bVar6) {
        BVSparse<Memory::JitArenaAllocator>::Clear
                  ((local_40->globOptData).liveLossyInt32Syms,(this_00->super_Sym).m_id);
      }
      bVar6 = false;
    }
  }
  pBVar1 = local_40;
  BVar7 = BVSparse<Memory::JitArenaAllocator>::Test
                    ((local_40->globOptData).liveInt32Syms,(this_00->super_Sym).m_id);
  if ((BVar7 == '\0') ||
     (BVar7 = BVSparse<Memory::JitArenaAllocator>::Test
                        ((pBVar1->globOptData).liveLossyInt32Syms,(this_00->super_Sym).m_id),
     BVar7 != '\0')) {
    BVar7 = BVSparse<Memory::JitArenaAllocator>::Test
                      ((pBVar1->globOptData).liveFloat64Syms,(this_00->super_Sym).m_id);
    pGVar4 = local_60;
    if (BVar7 == '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x2cb6,"((0))","UNREACHED");
      if (!bVar6) goto LAB_0041c626;
      sym = (StackSym *)0x0;
      local_38 = (GlobOptBlockData *)((ulong)local_38 & 0xffffffff00000000);
      type = TyIllegal;
      goto LAB_0041c28c;
    }
    _intConstantValue = StackSym::GetFloat64EquivSym(this_00,local_60->func);
    this_01 = local_48;
    _intConstantValue->field_0x1a = _intConstantValue->field_0x1a | 2;
    if (bVar6) {
      local_58 = NewGenericValue(pGVar4,(ValueType)0x108);
      this_01 = local_58->valueInfo;
      GlobOptBlockData::SetValue(local_38,local_58,&this_00->super_Sym);
      IR::Opnd::SetValueType
                (&local_50->super_Opnd,
                 (ValueType)
                 *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                  &(this_01->super_ValueType).field_0.field_0);
      local_38 = (GlobOptBlockData *)((ulong)local_38 & 0xffffffff00000000);
    }
    else {
      bVar6 = ValueType::IsNumber(&local_48->super_ValueType);
      pGVar4 = local_60;
      if (bVar6) {
        type = TyFloat64;
        local_38 = (GlobOptBlockData *)((ulong)local_38 & 0xffffffff00000000);
        sym = _intConstantValue;
        goto LAB_0041c294;
      }
      this_01 = ValueInfo::SpecializeToFloat64(this_01,local_60->alloc);
      local_38 = (GlobOptBlockData *)((ulong)local_38 & 0xffffffff00000000);
      ChangeValueInfo(pGVar4,local_40,local_58,this_01,false,false);
      IR::Opnd::SetValueType
                (&local_50->super_Opnd,
                 (ValueType)
                 *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                  &(this_01->super_ValueType).field_0.field_0);
    }
    type = TyFloat64;
    sym = _intConstantValue;
  }
  else {
    sym = StackSym::GetInt32EquivSym(this_00,local_60->func);
    if (bVar6) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x2c90,"(valueInfo)","valueInfo");
      if (!bVar6) goto LAB_0041c626;
      *puVar8 = 0;
    }
    bVar6 = ValueType::IsInt(&local_48->super_ValueType);
    if (bVar6) {
      type = TyInt32;
      local_38 = (GlobOptBlockData *)CONCAT44(local_38._4_4_,(int)CONCAT71(extraout_var,1));
      this_01 = local_48;
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x2c91,"(valueInfo->IsInt())","valueInfo->IsInt()");
      if (!bVar6) goto LAB_0041c626;
      type = TyInt32;
      local_38 = (GlobOptBlockData *)CONCAT44(local_38._4_4_,(int)CONCAT71(extraout_var_00,1));
LAB_0041c28c:
      *puVar8 = 0;
      this_01 = local_48;
    }
LAB_0041c294:
    if (this_01 == (ValueInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x2cb9,"(valueInfo)","valueInfo");
      if (!bVar6) goto LAB_0041c626;
      *puVar8 = 0;
      this_01 = (ValueInfo *)0x0;
    }
  }
  bVar6 = ValueInfo::TryGetIntConstantValue(this_01,&local_70,false);
  if (bVar6) {
    this_02 = IR::IntConstOpnd::New((long)local_70,TyInt32,instr->m_func,false);
    func = instr->m_func;
    opcode = LdC_A_I4;
  }
  else {
    this_02 = (IntConstOpnd *)IR::RegOpnd::New(sym,type,instr->m_func);
    IR::Opnd::SetIsJITOptimizedReg((Opnd *)this_02,true);
    func = instr->m_func;
    opcode = ToVar;
  }
  this_03 = IR::Instr::New(opcode,&local_50->super_Opnd,&this_02->super_Opnd,func);
  IR::Instr::SetByteCodeOffset(this_03,instr);
  this_04 = IR::Opnd::AsRegOpnd(this_03->m_dst);
  IR::Opnd::SetIsJITOptimizedReg(&this_04->super_Opnd,true);
  if ((char)local_38 == '\0') {
    valueType = (anon_union_2_4_ea848c7b_for_ValueType_13)
                *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                 &(this_01->super_ValueType).field_0.field_0;
  }
  else {
    valueType.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::GetTaggedInt();
  }
  IR::Opnd::SetValueType(this_03->m_dst,(ValueType)valueType.field_0);
  IR::Opnd::SetValueType(this_03->m_src1,(ValueType)valueType.field_0);
  pBVar5 = local_40;
  pBVar1 = local_40->next;
  ppFVar10 = (Func **)&pBVar1->firstInstr;
  if (pBVar1 == (BasicBlock *)0x0) {
    ppFVar10 = &local_40->func;
  }
  lVar9 = 0x18;
  if (pBVar1 == (BasicBlock *)0x0) {
    lVar9 = 0xd0;
  }
  afterThisInstr = instr->m_prev;
  if ((*(Instr **)((long)&(*ppFVar10)->m_alloc + lVar9) == instr) &&
     ((instr->m_kind == InstrKindBranch || (instr->m_opcode == BailTarget)))) {
    for (; afterThisInstr->m_opcode == ByteCodeUses; afterThisInstr = afterThisInstr->m_prev) {
    }
  }
  BasicBlock::InsertInstrAfter(local_40,this_03,afterThisInstr);
  BVSparse<Memory::JitArenaAllocator>::Set
            ((pBVar5->globOptData).liveVarSyms,(this_00->super_Sym).m_id);
  pGVar4 = local_60;
  sourceContextId = Func::GetSourceContextId(local_60->func);
  functionId = Func::GetLocalFunctionId(pGVar4->func);
  bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,GlobOptPhase,sourceContextId,functionId);
  uVar3 = local_6c;
  if (bVar6) {
    Output::Print(L"TRACE ");
    if (pGVar4->prePassLoop != (Loop *)0x0) {
      Output::Print(L"[%d, %d]",(ulong)(pGVar4->rootLoopPrePass->loopNumber - 1),
                    (ulong)(pGVar4->prePassLoop->loopNumber - 1));
    }
    Output::Print(L": ");
    IR::Opnd::Dump(&local_50->super_Opnd);
    Output::Print(L" : ");
    Output::Print(L"Converting to var\n");
    Output::Flush();
  }
  if (local_40->loop != (Loop *)0x0) {
    if (pGVar4->prePassLoop != (Loop *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x2cef,"(!this->IsLoopPrePass())","!this->IsLoopPrePass()");
      if (!bVar6) {
LAB_0041c626:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar8 = 0;
    }
    TryHoistInvariant(pGVar4,this_03,local_40,local_58,local_58,(Value *)0x0,false,false,false,
                      BailOutInvalid);
  }
  if ((char)uVar3 != '\0') {
    ProcessKills(pGVar4,this_03);
    ValueNumberObjectType(pGVar4,this_03->m_dst,this_03);
    if ((instr->m_src1 != (Opnd *)0x0) && (bVar6 = IR::Opnd::IsSymOpnd(instr->m_src1), bVar6)) {
      this_05 = IR::Opnd::AsSymOpnd(instr->m_src1);
      bVar6 = IR::SymOpnd::IsPropertySymOpnd(this_05);
      if (bVar6) {
        this_06 = IR::Opnd::AsPropertySymOpnd(instr->m_src1);
        bVar6 = IR::PropertySymOpnd::IsTypeCheckSeqCandidate(this_06);
        if (bVar6) {
          IR::PropertySymOpnd::SetTypeChecked(this_06,false);
          IR::PropertySymOpnd::SetTypeAvailable(this_06,false);
          IR::PropertySymOpnd::SetWriteGuardChecked(this_06,false);
        }
        FinishOptPropOp(pGVar4,instr,this_06,(BasicBlock *)0x0,false,(bool *)0x0,(bool *)0x0);
        instr = SetTypeCheckBailOut(pGVar4,instr->m_src1,instr,(BailOutInfo *)0x0);
      }
    }
  }
  return instr;
}

Assistant:

IR::Instr *
GlobOpt::ToVar(IR::Instr *instr, IR::RegOpnd *regOpnd, BasicBlock *block, Value *value, bool needsUpdate)
{
    IR::Instr *newInstr;
    StackSym *varSym = regOpnd->m_sym;

    if (IsTypeSpecPhaseOff(this->func))
    {
        return instr;
    }

    if (this->IsLoopPrePass())
    {
        block->globOptData.liveVarSyms->Set(varSym->m_id);
        return instr;
    }

    if (block->globOptData.liveVarSyms->Test(varSym->m_id))
    {
        // Already live, nothing to do
        return instr;
    }

    if (!varSym->IsVar())
    {
        Assert(!varSym->IsTypeSpec());
        // Leave non-vars alone.
        return instr;
    }

    Assert(block->globOptData.IsTypeSpecialized(varSym));

    if (!value)
    {
        value = block->globOptData.FindValue(varSym);
    }

    ValueInfo *valueInfo = value ? value->GetValueInfo() : nullptr;
    if(valueInfo && valueInfo->IsInt())
    {
        // If two syms have the same value, one is lossy-int-specialized, and then the other is int-specialized, the value
        // would have been updated to definitely int. Upon using the lossy-int-specialized sym later, it would be flagged as
        // lossy while the value is definitely int. Since the bit-vectors are based on the sym and not the value, update the
        // lossy state.
        block->globOptData.liveLossyInt32Syms->Clear(varSym->m_id);
    }

    IRType fromType = TyIllegal;
    StackSym *typeSpecSym = nullptr;

    if (block->globOptData.liveInt32Syms->Test(varSym->m_id) && !block->globOptData.liveLossyInt32Syms->Test(varSym->m_id))
    {
        fromType = TyInt32;
        typeSpecSym = varSym->GetInt32EquivSym(this->func);
        Assert(valueInfo);
        Assert(valueInfo->IsInt());
    }
    else if (block->globOptData.liveFloat64Syms->Test(varSym->m_id))
    {

        fromType = TyFloat64;
        typeSpecSym = varSym->GetFloat64EquivSym(this->func);

        // Ensure that all bailout FromVars that generate a value for this type-specialized sym will bail out on any non-number
        // value, even ones that have already been generated before. Float-specialized non-number values cannot be converted
        // back to Var since they will not go back to the original non-number value. The dead-store pass will update the bailout
        // kind on already-generated FromVars based on this bit.
        typeSpecSym->m_requiresBailOnNotNumber = true;

        // A previous float conversion may have used BailOutPrimitiveButString, which does not change the value type to say
        // definitely float, since it can also be a non-string primitive. The convert back to Var though, will cause that
        // bailout kind to be changed to BailOutNumberOnly in the dead-store phase, so from the point of the initial conversion
        // to float, that the value is definitely number. Since we don't know where the FromVar is, change the value type here.
        if(valueInfo)
        {
            if(!valueInfo->IsNumber())
            {
                valueInfo = valueInfo->SpecializeToFloat64(alloc);
                ChangeValueInfo(block, value, valueInfo);
                regOpnd->SetValueType(valueInfo->Type());
            }
        }
        else
        {
            value = NewGenericValue(ValueType::Float);
            valueInfo = value->GetValueInfo();
            block->globOptData.SetValue(value, varSym);
            regOpnd->SetValueType(valueInfo->Type());
        }
    }
    else
    {
        Assert(UNREACHED);
    }

    AssertOrFailFast(valueInfo);

    int32 intConstantValue;
    if (valueInfo->TryGetIntConstantValue(&intConstantValue))
    {
        // Lower will tag or create a number directly
        newInstr = IR::Instr::New(Js::OpCode::LdC_A_I4, regOpnd,
            IR::IntConstOpnd::New(intConstantValue, TyInt32, instr->m_func), instr->m_func);
    }
    else
    {
        IR::RegOpnd * regNew = IR::RegOpnd::New(typeSpecSym, fromType, instr->m_func);
        Js::OpCode opcode = Js::OpCode::ToVar;
        regNew->SetIsJITOptimizedReg(true);

        newInstr = IR::Instr::New(opcode, regOpnd, regNew, instr->m_func);
    }
    newInstr->SetByteCodeOffset(instr);
    newInstr->GetDst()->AsRegOpnd()->SetIsJITOptimizedReg(true);

    ValueType valueType = valueInfo->Type();
    if(fromType == TyInt32)
    {
    #if !INT32VAR // All 32-bit ints are taggable on 64-bit architectures
        IntConstantBounds constantBounds;
        AssertVerify(valueInfo->TryGetIntConstantBounds(&constantBounds));
        if(constantBounds.IsTaggable())
    #endif
        {
            // The value is within the taggable range, so set the opnd value types to TaggedInt to avoid the overflow check
            valueType = ValueType::GetTaggedInt();
        }
    }
    newInstr->GetDst()->SetValueType(valueType);
    newInstr->GetSrc1()->SetValueType(valueType);

    IR::Instr *insertAfterInstr = instr->m_prev;
    if (instr == block->GetLastInstr() &&
        (instr->IsBranchInstr() || instr->m_opcode == Js::OpCode::BailTarget))
    {
        // Don't insert code between the branch and the preceding ByteCodeUses instrs...
        while(insertAfterInstr->m_opcode == Js::OpCode::ByteCodeUses)
        {
            insertAfterInstr = insertAfterInstr->m_prev;
        }
    }
    block->InsertInstrAfter(newInstr, insertAfterInstr);

    block->globOptData.liveVarSyms->Set(varSym->m_id);

    GOPT_TRACE_OPND(regOpnd, _u("Converting to var\n"));

    if (block->loop)
    {
        Assert(!this->IsLoopPrePass());
        this->TryHoistInvariant(newInstr, block, value, value, nullptr, false);
    }

    if (needsUpdate)
    {
        // Make sure that the kill effect of the ToVar instruction is tracked and that the kill of a property
        // type is reflected in the current instruction.
        this->ProcessKills(newInstr);
        this->ValueNumberObjectType(newInstr->GetDst(), newInstr);

        if (instr->GetSrc1() && instr->GetSrc1()->IsSymOpnd() && instr->GetSrc1()->AsSymOpnd()->IsPropertySymOpnd())
        {
            // Reprocess the load source. We need to reset the PropertySymOpnd fields first.
            IR::PropertySymOpnd *propertySymOpnd = instr->GetSrc1()->AsPropertySymOpnd();
            if (propertySymOpnd->IsTypeCheckSeqCandidate())
            {
                propertySymOpnd->SetTypeChecked(false);
                propertySymOpnd->SetTypeAvailable(false);
                propertySymOpnd->SetWriteGuardChecked(false);
            }

            this->FinishOptPropOp(instr, propertySymOpnd);
            instr = this->SetTypeCheckBailOut(instr->GetSrc1(), instr, nullptr);
        }
    }

    return instr;
}